

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O3

Oop __thiscall Lodtalk::VMContext::getGlobalFromName(VMContext *this,char *name)

{
  Oop key;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  key = ByteSymbol::fromNative(this,&local_30);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)
          HashedCollection::
          internalKeyValueAtOrNil<Lodtalk::Oop(Lodtalk::Oop),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this->globalDictionary,key,getLookupKeyKey,identityHashOf,
                     identityOopEquals);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (Oop)aVar1.pointer;
}

Assistant:

Oop VMContext::getGlobalFromName(const char *name)
{
	return getGlobalFromSymbol(makeByteSymbol(name));
}